

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

void fillnocolliding(lua_State *L,context *ctx)

{
  int iVar1;
  node *n_00;
  node *n;
  int local_28;
  uint32_t keyhash;
  int keytype;
  int key;
  table *tbl;
  context *ctx_local;
  lua_State *L_local;
  
  _keytype = ctx->tbl;
  tbl = (table *)ctx;
  ctx_local = (context *)L;
  lua_pushnil(L);
  while (iVar1 = lua_next((lua_State *)ctx_local,1), iVar1 != 0) {
    iVar1 = ishashkey((context *)tbl,(lua_State *)ctx_local,-2,(int *)&keyhash,
                      (uint32_t *)((long)&n + 4),&local_28);
    if (iVar1 == 0) {
      setarray((context *)tbl,(lua_State *)ctx_local,-1,keyhash);
    }
    else {
      n_00 = _keytype->hash + (ulong)n._4_4_ % (ulong)(uint)_keytype->sizehash;
      if (n_00->valuetype == '\0') {
        n_00->key = keyhash;
        n_00->keytype = (uint8_t)local_28;
        n_00->keyhash = n._4_4_;
        n_00->next = -1;
        n_00->nocolliding = '\x01';
        setvalue((context *)tbl,(lua_State *)ctx_local,-1,n_00);
      }
    }
    lua_settop((lua_State *)ctx_local,-2);
  }
  return;
}

Assistant:

static void
fillnocolliding(lua_State *L, struct context *ctx) {
	struct table * tbl = ctx->tbl;
	lua_pushnil(L);
	while (lua_next(L, 1) != 0) {
		int key;
		int keytype;
		uint32_t keyhash;
		if (!ishashkey(ctx, L, -2, &key, &keyhash, &keytype)) {
			setarray(ctx, L, -1, key);
		} else {
			struct node * n = &tbl->hash[keyhash % tbl->sizehash];
			if (n->valuetype == VALUETYPE_NIL) {
				n->key = key;
				n->keytype = keytype;
				n->keyhash = keyhash;
				n->next = -1;
				n->nocolliding = 1;
				setvalue(ctx, L, -1, n);	// set n->v , n->valuetype
			}
		}
		lua_pop(L,1);
	}
}